

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPipelineStatisticsQueryTests.cpp
# Opt level: O2

void __thiscall
glcts::PipelineStatisticsQueryTestFunctional3::PipelineStatisticsQueryTestFunctional3
          (PipelineStatisticsQueryTestFunctional3 *this,Context *context)

{
  PipelineStatisticsQueryTestFunctionalBase::PipelineStatisticsQueryTestFunctionalBase
            (&this->super_PipelineStatisticsQueryTestFunctionalBase,context,
             "functional_primitives_vertices_submitted_and_clipping_input_output_primitives",
             "Verifies that GL_PRIMITIVES_SUBMITTED_ARB, GL_VERTICES_SUBMITTED_ARB, GL_CLIPPING_INPUT_PRIMITIVES_ARB, and GL_CLIPPING_OUTPUT_PRIMITIVES_ARB queries work correctly."
            );
  (this->super_PipelineStatisticsQueryTestFunctionalBase).super_TestCase.super_TestCase.
  super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_01ddb410;
  this->m_is_primitive_restart_enabled = false;
  return;
}

Assistant:

PipelineStatisticsQueryTestFunctional3::PipelineStatisticsQueryTestFunctional3(deqp::Context& context)
	: PipelineStatisticsQueryTestFunctionalBase(
		  context, "functional_primitives_vertices_submitted_and_clipping_input_output_primitives",
		  "Verifies that GL_PRIMITIVES_SUBMITTED_ARB, GL_VERTICES_SUBMITTED_ARB, "
		  "GL_CLIPPING_INPUT_PRIMITIVES_ARB, and GL_CLIPPING_OUTPUT_PRIMITIVES_ARB "
		  "queries work correctly.")
	, m_is_primitive_restart_enabled(false)
{
	/* Left blank intentionally */
}